

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O1

int ndn_name_append_bytes_component(ndn_name_t *name,uint8_t *value,uint32_t size)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  
  uVar3 = (ulong)name->components_size;
  iVar2 = -10;
  if (uVar3 < 10) {
    if (size < 0x25) {
      memcpy(&local_50,value,(ulong)size);
      uStack_2c = CONCAT31(uStack_2c._1_3_,(char)size);
    }
    name->components[uVar3].type = 8;
    puVar1 = name->components[uVar3].value;
    *(undefined8 *)puVar1 = local_50;
    *(undefined8 *)(puVar1 + 8) = uStack_48;
    puVar1 = name->components[uVar3].value;
    *(undefined8 *)(puVar1 + 0x10) = local_40;
    *(undefined8 *)(puVar1 + 0x18) = uStack_38;
    *(ulong *)(name->components[uVar3].value + 0x20) = CONCAT44(uStack_2c,local_30);
    name->components_size = name->components_size + '\x01';
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
ndn_name_append_bytes_component(ndn_name_t* name, const uint8_t* value, uint32_t size)
{
  if (name->components_size + 1 <= NDN_NAME_COMPONENTS_SIZE) {
    name_component_t comp;
    name_component_from_buffer(&comp, TLV_GenericNameComponent, value, size);
    ndn_name_append_component(name, &comp);
    return 0;
  }
  else
    return NDN_OVERSIZE;
}